

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::(anonymous_namespace)::set_value_ascii<char*,unsigned_long>
               (char **dest,unsigned_long *header,uintptr_t header_mask,char *buf)

{
  bool bVar1;
  unsigned_long *in_RCX;
  char **in_RDX;
  size_t in_RSI;
  unsigned_long *header_00;
  char **dest_00;
  
  header_00 = in_RCX;
  dest_00 = in_RDX;
  strlen((char *)in_RCX);
  bVar1 = strcpy_insitu<char*,unsigned_long>
                    (dest_00,header_00,(uintptr_t)in_RCX,(char_t *)in_RDX,in_RSI);
  return bVar1;
}

Assistant:

PUGI__FN bool set_value_ascii(String& dest, Header& header, uintptr_t header_mask, char* buf)
	{
	#ifdef PUGIXML_WCHAR_MODE
		char_t wbuf[128];
		assert(strlen(buf) < sizeof(wbuf) / sizeof(wbuf[0]));

		size_t offset = 0;
		for (; buf[offset]; ++offset) wbuf[offset] = buf[offset];

		return strcpy_insitu(dest, header, header_mask, wbuf, offset);
	#else
		return strcpy_insitu(dest, header, header_mask, buf, strlen(buf));
	#endif
	}